

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

void Cnf_ComputeClauses(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                       Vec_Int_t *vMap,Vec_Int_t *vCover,Vec_Int_t *vClauses)

{
  uint Entry;
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  word wVar6;
  int iVar7;
  uint uVar8;
  char *p_00;
  word Truth;
  
  if ((pRoot->field_0x18 & 0x10) == 0) {
    __assert_fail("pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                  ,0xcc,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  vClauses->nSize = 0;
  iVar7 = 0;
  Entry = Cnf_ObjGetLit(vMap,pRoot,0);
  Cnf_CollectLeaves(pRoot,vLeaves,0);
  Cnf_CollectVolume(p,pRoot,vLeaves,vNodes);
  p_00 = (char *)vNodes;
  pAVar4 = (Aig_Obj_t *)Vec_PtrEntryLast(vNodes);
  if (pAVar4 != pRoot) {
    __assert_fail("pRoot == Vec_PtrEntryLast(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                  ,0xd4,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  for (; iVar7 < vNodes->nSize; iVar7 = iVar7 + 1) {
    p_00 = (char *)vNodes;
    pvVar5 = Vec_PtrEntry(vNodes,iVar7);
    if ((((*(ulong *)((long)pvVar5 + 8) & 1) != 0) &&
        ((*(byte *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)) ||
       (((*(ulong *)((long)pvVar5 + 0x10) & 1) != 0 &&
        ((*(byte *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x18) & 0x10) == 0))))
    break;
  }
  if (vNodes->nSize == iVar7) {
    Cnf_CollectLeaves(pRoot,vLeaves,1);
    Vec_IntPush(vClauses,0);
    Vec_IntPush(vClauses,Entry);
    for (iVar7 = 0; iVar1 = vLeaves->nSize, iVar7 < iVar1; iVar7 = iVar7 + 1) {
      pvVar5 = Vec_PtrEntry(vLeaves,iVar7);
      iVar1 = Cnf_ObjGetLit(vMap,(Aig_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe),~(uint)pvVar5 & 1
                           );
      Vec_IntPush(vClauses,iVar1);
    }
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      pvVar5 = Vec_PtrEntry(vLeaves,iVar7);
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,Entry ^ 1);
      iVar1 = Cnf_ObjGetLit(vMap,(Aig_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe),(uint)pvVar5 & 1)
      ;
      Vec_IntPush(vClauses,iVar1);
      iVar1 = vLeaves->nSize;
    }
  }
  else {
    if (6 < vLeaves->nSize) {
      p_00 = "FastCnfGeneration:  Internal error!!!";
      puts("FastCnfGeneration:  Internal error!!!");
      if (6 < vLeaves->nSize) {
        __assert_fail("Vec_PtrSize(vLeaves) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                      ,0xf0,
                      "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    wVar6 = Cnf_CutDeriveTruth((Aig_Man_t *)p_00,vLeaves,vNodes);
    Truth = wVar6;
    if (wVar6 + 1 < 2) {
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,Entry ^ wVar6 == 0);
      return;
    }
    iVar1 = 0;
    iVar7 = Kit_TruthIsop((uint *)&Truth,vLeaves->nSize,vCover,0);
    if (iVar7 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0xfb,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (; iVar1 < vCover->nSize; iVar1 = iVar1 + 1) {
      uVar2 = Vec_IntEntry(vCover,iVar1);
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,Entry);
      for (iVar7 = 0; iVar7 < vLeaves->nSize; iVar7 = iVar7 + 1) {
        uVar8 = uVar2 & 3;
        if (uVar8 != 0) {
          if (uVar8 == 3) {
            __assert_fail("(Cube & 3) != 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                          ,0x105,
                          "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iVar7);
          iVar3 = Cnf_ObjGetLit(vMap,pAVar4,(uint)(uVar8 != 1));
          Vec_IntPush(vClauses,iVar3);
        }
        uVar2 = (int)uVar2 >> 2;
      }
    }
    Truth = ~Truth;
    iVar1 = 0;
    iVar7 = Kit_TruthIsop((uint *)&Truth,vLeaves->nSize,vCover,0);
    if (iVar7 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x10d,
                    "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (; iVar1 < vCover->nSize; iVar1 = iVar1 + 1) {
      uVar2 = Vec_IntEntry(vCover,iVar1);
      Vec_IntPush(vClauses,0);
      Vec_IntPush(vClauses,Entry ^ 1);
      for (iVar7 = 0; iVar7 < vLeaves->nSize; iVar7 = iVar7 + 1) {
        uVar8 = uVar2 & 3;
        if (uVar8 != 0) {
          if (uVar8 == 3) {
            __assert_fail("(Cube & 3) != 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                          ,0x116,
                          "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,iVar7);
          iVar3 = Cnf_ObjGetLit(vMap,pAVar4,(uint)(uVar8 != 1));
          Vec_IntPush(vClauses,iVar3);
        }
        uVar2 = (int)uVar2 >> 2;
      }
    }
  }
  return;
}

Assistant:

void Cnf_ComputeClauses( Aig_Man_t * p, Aig_Obj_t * pRoot, 
    Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vMap, Vec_Int_t * vCover, Vec_Int_t * vClauses )
{
    Aig_Obj_t * pLeaf;
    int c, k, Cube, OutLit, RetValue;
    word Truth;
    assert( pRoot->fMarkA );

    Vec_IntClear( vClauses );

    OutLit = Cnf_ObjGetLit( vMap, pRoot, 0 );
    // detect cone
    Cnf_CollectLeaves( pRoot, vLeaves, 0 );
    Cnf_CollectVolume( p, pRoot, vLeaves, vNodes );
    assert( pRoot == Vec_PtrEntryLast(vNodes) );
    // check if this is an AND-gate
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pLeaf, k )
    {
        if ( Aig_ObjFaninC0(pLeaf) && !Aig_ObjFanin0(pLeaf)->fMarkA )
            break;
        if ( Aig_ObjFaninC1(pLeaf) && !Aig_ObjFanin1(pLeaf)->fMarkA )
            break;
    }
    if ( k == Vec_PtrSize(vNodes) )
    {
        Cnf_CollectLeaves( pRoot, vLeaves, 1 );
        // write big clause
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), !Aig_IsComplement(pLeaf)) );
        // write small clauses
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
        {
            Vec_IntPush( vClauses, 0 );
            Vec_IntPush( vClauses, OutLit ^ 1 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), Aig_IsComplement(pLeaf)) );
        }
        return;
    }
    if ( Vec_PtrSize(vLeaves) > 6 )
        printf( "FastCnfGeneration:  Internal error!!!\n" );
    assert( Vec_PtrSize(vLeaves) <= 6 );

    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );
    if ( Truth == 0 || Truth == ~(word)0 )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, (Truth == 0) ? (OutLit ^ 1) : OutLit );
        return;
    }

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );

    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit ^ 1 );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }
}